

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_context.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::Context::Context
          (Context *this,FileDescriptor *file,Options *options)

{
  ClassNameResolver *this_00;
  Options *options_local;
  FileDescriptor *file_local;
  Context *this_local;
  
  this_00 = (ClassNameResolver *)operator_new(0x30);
  ClassNameResolver::ClassNameResolver(this_00);
  internal::scoped_ptr<google::protobuf::compiler::java::ClassNameResolver>::scoped_ptr
            (&this->name_resolver_,this_00);
  std::
  map<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::FieldGeneratorInfo,_std::less<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_google::protobuf::compiler::java::FieldGeneratorInfo>_>_>
  ::map(&this->field_generator_info_map_);
  std::
  map<const_google::protobuf::OneofDescriptor_*,_google::protobuf::compiler::java::OneofGeneratorInfo,_std::less<const_google::protobuf::OneofDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::OneofDescriptor_*const,_google::protobuf::compiler::java::OneofGeneratorInfo>_>_>
  ::map(&this->oneof_generator_info_map_);
  Options::Options(&this->options_,options);
  InitializeFieldGeneratorInfo(this,file);
  return;
}

Assistant:

Context::Context(const FileDescriptor* file, const Options& options)
    : name_resolver_(new ClassNameResolver), options_(options) {
  InitializeFieldGeneratorInfo(file);
}